

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedString *FS)

{
  int iVar1;
  uint NumSpaces;
  uint NumSpaces_00;
  int PadAmount;
  size_t Difference;
  FormattedString *FS_local;
  raw_ostream *this_local;
  
  if ((*(ulong *)(FS + 8) < (ulong)*(uint *)(FS + 0x10)) && (*(int *)(FS + 0x14) != 0)) {
    iVar1 = *(int *)(FS + 0x14);
    NumSpaces_00 = (uint)((ulong)*(uint *)(FS + 0x10) - *(long *)(FS + 8));
    if (iVar1 == 1) {
      operator<<(this,*(StringRef *)FS);
      indent(this,NumSpaces_00);
    }
    else if (iVar1 == 2) {
      indent(this,NumSpaces_00);
      operator<<(this,*(StringRef *)FS);
    }
    else {
      if (iVar1 != 3) {
        llvm_unreachable_internal
                  ("Bad Justification",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                   ,0x163);
      }
      NumSpaces = (uint)((ulong)*(uint *)(FS + 0x10) - *(long *)(FS + 8) >> 1);
      indent(this,NumSpaces);
      operator<<(this,*(StringRef *)FS);
      indent(this,NumSpaces_00 - NumSpaces);
    }
  }
  else {
    operator<<(this,*(StringRef *)FS);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedString &FS) {
  if (FS.Str.size() >= FS.Width || FS.Justify == FormattedString::JustifyNone) {
    this->operator<<(FS.Str);
    return *this;
  }
  const size_t Difference = FS.Width - FS.Str.size();
  switch (FS.Justify) {
  case FormattedString::JustifyLeft:
    this->operator<<(FS.Str);
    this->indent(Difference);
    break;
  case FormattedString::JustifyRight:
    this->indent(Difference);
    this->operator<<(FS.Str);
    break;
  case FormattedString::JustifyCenter: {
    int PadAmount = Difference / 2;
    this->indent(PadAmount);
    this->operator<<(FS.Str);
    this->indent(Difference - PadAmount);
    break;
  }
  default:
    llvm_unreachable("Bad Justification");
  }
  return *this;
}